

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O1

void * xmlMemMalloc(size_t size)

{
  undefined4 *puVar1;
  
  xmlInitParser();
  if ((size < 0xfffffffffffffff0) &&
     (puVar1 = (undefined4 *)malloc(size + 0x10), puVar1 != (undefined4 *)0x0)) {
    *puVar1 = 0x5aa5;
    *(size_t *)(puVar1 + 2) = size;
    xmlMutexLock(&xmlMemMutex);
    debugMemSize = debugMemSize + size;
    debugMemBlocks = debugMemBlocks + 1;
    xmlMutexUnlock(&xmlMemMutex);
    return puVar1 + 4;
  }
  return (void *)0x0;
}

Assistant:

void *
xmlMemMalloc(size_t size)
{
    MEMHDR *p;

    xmlInitParser();

    if (size > (MAX_SIZE_T - RESERVE_SIZE))
        return(NULL);

    p = (MEMHDR *) malloc(RESERVE_SIZE + size);
    if (!p)
        return(NULL);
    p->mh_tag = MEMTAG;
    p->mh_size = size;

    xmlMutexLock(&xmlMemMutex);
    debugMemSize += size;
    debugMemBlocks++;
    xmlMutexUnlock(&xmlMemMutex);

    return(HDR_2_CLIENT(p));
}